

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O1

float parseFloat(char *p,char **end,char *endLine)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  
  pcVar3 = p;
  if (*p == '\0') {
    *end = p;
    return 0.0;
  }
  do {
    cVar1 = *pcVar3;
    bVar9 = pcVar3 < endLine;
    pcVar3 = pcVar3 + 1;
    if (cVar1 != ' ') break;
  } while (endLine == (char *)0x0 || bVar9);
  pbVar8 = (byte *)(pcVar3 + ((ulong)(cVar1 == '-') - 1));
  bVar5 = *pbVar8;
  fVar14 = 0.0;
  if ((endLine == (char *)0x0 || pbVar8 < endLine) && ((byte)(bVar5 - 0x30) < 10)) {
    pbVar4 = (byte *)(pcVar3 + (cVar1 == '-'));
    do {
      pbVar8 = pbVar8 + 1;
      fVar14 = fVar14 * 10.0 + (float)(int)(char)bVar5 + -48.0;
      bVar5 = *pbVar4;
      if (endLine != (char *)0x0 && endLine <= pbVar4) break;
      pbVar4 = pbVar4 + 1;
    } while ((byte)(bVar5 - 0x30) < 10);
  }
  pbVar4 = pbVar8;
  if (bVar5 == 0x2e) {
    pbVar4 = pbVar8 + 1;
    bVar5 = pbVar8[1];
    if ((pbVar4 < endLine || endLine == (char *)0x0) && (byte)(bVar5 - 0x30) < 10) {
      iVar2 = 0;
      pbVar8 = pbVar8 + 2;
      do {
        pbVar4 = pbVar8;
        if (iVar2 < 0x23) {
          fVar14 = fVar14 * 10.0 + (float)(byte)(bVar5 - 0x30);
          iVar2 = iVar2 + 1;
        }
      } while ((endLine == (char *)0x0 || pbVar4 < endLine) &&
              (bVar5 = *pbVar4, pbVar8 = pbVar4 + 1, (byte)(bVar5 - 0x30) < 10));
      goto LAB_0022c81f;
    }
  }
  iVar2 = 0;
LAB_0022c81f:
  pbVar8 = pbVar4;
  iVar6 = 0;
  if (((*pbVar4 | 0x20) == 0x65) && ((endLine == (char *)0x0 || (pbVar4 < endLine)))) {
    bVar10 = endLine == (char *)0x0;
    bVar11 = pbVar4[1] == 0x2d;
    bVar9 = pbVar4 + 1 < endLine;
    pbVar8 = pbVar4 + 2;
    if (!bVar9 && !bVar10 || !bVar11) {
      pbVar8 = pbVar4 + 1;
    }
    iVar7 = 0;
    if ((bVar10 || pbVar8 < endLine) &&
       (bVar5 = pbVar4[(ulong)((bVar9 || bVar10) && bVar11) + 1], iVar7 = 0,
       (byte)(bVar5 - 0x30) < 10)) {
      iVar7 = 0;
      do {
        pbVar8 = pbVar8 + 1;
        iVar7 = (int)(char)bVar5 + iVar7 * 10 + -0x30;
        if (endLine != (char *)0x0 && endLine <= pbVar8) break;
        bVar5 = *pbVar8;
      } while ((byte)(bVar5 - 0x30) < 10);
    }
    iVar6 = -iVar7;
    if (!bVar9 && !bVar10 || !bVar11) {
      iVar6 = iVar7;
    }
  }
  if ((((ulong)*pbVar8 < 0x21) && ((0x100000600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)) ||
     (pbVar8 == (byte *)endLine)) {
    fVar12 = powf(10.0,(float)(iVar6 - iVar2));
    fVar14 = fVar14 * fVar12;
    *end = (char *)pbVar8;
    if (cVar1 == '-') {
      fVar14 = -fVar14;
    }
  }
  else {
    dVar13 = strtod(p,end);
    fVar14 = (float)dVar13;
  }
  return fVar14;
}

Assistant:

inline float parseFloat(char* p, char** end, char* endLine = nullptr)
{
  char* start = p;
  bool endLine_is_null = endLine == nullptr;

  if (!*p)
  {
    *end = p;
    return 0;
  }
  int s = 1;
  while ((*p == ' ') && (endLine_is_null || p < endLine)) p++;

  if (*p == '-')
  {
    s = -1;
    p++;
  }

  float acc = 0;
  while (*p >= '0' && *p <= '9' && (endLine_is_null || p < endLine)) acc = acc * 10 + *p++ - '0';

  int num_dec = 0;
  if (*p == '.')
  {
    while (*(++p) >= '0' && *p <= '9' && (endLine_is_null || p < endLine))
    {
      if (num_dec < 35)
      {
        acc = acc * 10 + (*p - '0');
        num_dec++;
      }
    }
  }

  int exp_acc = 0;
  if ((*p == 'e' || *p == 'E') && (endLine_is_null || p < endLine))
  {
    p++;
    int exp_s = 1;
    if (*p == '-' && (endLine_is_null || p < endLine))
    {
      exp_s = -1;
      p++;
    }
    while (*p >= '0' && *p <= '9' && (endLine_is_null || p < endLine)) exp_acc = exp_acc * 10 + *p++ - '0';
    exp_acc *= exp_s;
  }
  if (*p == ' ' || *p == '\n' || *p == '\t' || p == endLine)  // easy case succeeded.
  {
    acc *= powf(10, (float)(exp_acc - num_dec));
    *end = p;
    return s * acc;
  }
  else
    return (float)strtod(start, end);
}